

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem traverseLclosure(global_State *g,LClosure *cl)

{
  UpVal *pUVar1;
  UpVal *uv;
  int i;
  LClosure *cl_local;
  global_State *g_local;
  
  if ((cl->p != (Proto *)0x0) && ((cl->p->marked & 3) != 0)) {
    reallymarkobject(g,(GCObject *)cl->p);
  }
  for (uv._4_4_ = 0; uv._4_4_ < (int)(uint)cl->nupvalues; uv._4_4_ = uv._4_4_ + 1) {
    pUVar1 = cl->upvals[uv._4_4_];
    if (pUVar1 != (UpVal *)0x0) {
      if ((pUVar1->v == (TValue *)&pUVar1->u) || (g->gcstate == '\b')) {
        if (((pUVar1->v->tt_ & 0x40U) != 0) && ((((pUVar1->v->value_).gc)->marked & 3) != 0)) {
          reallymarkobject(g,(pUVar1->v->value_).gc);
        }
      }
      else {
        (pUVar1->u).open.touched = 1;
      }
    }
  }
  return (long)(int)((cl->nupvalues - 1) * 8 + 0x28);
}

Assistant:

static lu_mem traverseLclosure (global_State *g, LClosure *cl) {
  int i;
  markobjectN(g, cl->p);  /* mark its prototype */
  for (i = 0; i < cl->nupvalues; i++) {  /* mark its upvalues */
    UpVal *uv = cl->upvals[i];
    if (uv != NULL) {
      if (upisopen(uv) && g->gcstate != GCSinsideatomic)
        uv->u.open.touched = 1;  /* can be marked in 'remarkupvals' */
      else
        markvalue(g, uv->v);
    }
  }
  return sizeLclosure(cl->nupvalues);
}